

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalBatchInsert::Sink
          (PhysicalBatchInsert *this,ExecutionContext *context,DataChunk *insert_chunk,
          OperatorSinkInput *input)

{
  BatchMemoryManager *this_00;
  unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true> *this_01;
  GlobalSinkState *gstate_p;
  BatchInsertLocalState *this_02;
  DuckTableEntry *table_entry;
  ClientContext *context_00;
  _Head_base<0UL,_duckdb::ConstraintState_*,_false> _Var1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> chunk;
  bool bVar3;
  int iVar4;
  int iVar5;
  element_type *batch_index;
  idx_t current_min_batch_index;
  undefined4 extraout_var;
  OptimisticDataWriter *this_03;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LocalStorage *this_04;
  undefined4 extraout_var_02;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  type constraint_state;
  undefined4 extraout_var_03;
  RowGroupCollection *this_05;
  pointer this_06;
  InternalException *this_07;
  pointer *__mutex;
  unique_lock<std::mutex> *this_08;
  unique_lock<std::mutex> guard;
  undefined1 local_68 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  gstate_p = input->global_state;
  this_02 = (BatchInsertLocalState *)input->local_state;
  table_entry = (DuckTableEntry *)
                gstate_p[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)insert_chunk;
  DataChunk::Flatten(insert_chunk);
  batch_index = (element_type *)
                optional_idx::GetIndex(&(this_02->super_LocalSinkState).partition_info.batch_index);
  if (*(element_type **)&gstate_p[2].super_StateWithBlockableTasks < batch_index) {
    this_00 = (BatchMemoryManager *)(gstate_p + 1);
    current_min_batch_index =
         optional_idx::GetIndex(&(this_02->super_LocalSinkState).partition_info.min_batch_index);
    BatchMemoryManager::UpdateMinBatchIndex(this_00,current_min_batch_index);
    bVar3 = BatchMemoryManager::OutOfMemory(this_00,(idx_t)batch_index);
    if (bVar3) {
      context_00 = context->client;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
      do {
        bVar3 = ExecuteTask(this,context_00,gstate_p,(LocalSinkState *)this_02);
      } while (bVar3);
      local_68._0_8_ = &gstate_p[1].super_StateWithBlockableTasks;
      this_08 = (unique_lock<std::mutex> *)local_68;
      local_68[8] = false;
      ::std::unique_lock<std::mutex>::lock(this_08);
      local_68[8] = true;
      local_40 = *(element_type **)&gstate_p[2].super_StateWithBlockableTasks;
      if (local_40 < batch_index) {
        this_08 = (unique_lock<std::mutex> *)&DAT_00000001;
        if (((((StateWithBlockableTasks *)&(local_48._M_pi)->_vptr__Sp_counted_base)->can_block).
             _M_base._M_i & 1U) != 0) {
          this_08 = (unique_lock<std::mutex> *)0x2;
          ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::push_back
                    ((vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_> *)
                     &gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                      __data.__list.__next,input->interrupt_state);
        }
      }
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_68);
      if (local_40 < batch_index) {
        return (SinkResultType)this_08;
      }
    }
  }
  if ((this_02->collection_index).index == 0xffffffffffffffff) {
    __mutex = &gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      ::std::__throw_system_error(iVar4);
    }
    BatchInsertLocalState::CreateNewCollection
              (this_02,context->client,table_entry,&this->insert_types);
    if ((this_02->optimistic_writer).
        super_unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::OptimisticDataWriter_*,_std::default_delete<duckdb::OptimisticDataWriter>_>
        .super__Head_base<0UL,_duckdb::OptimisticDataWriter_*,_false>._M_head_impl ==
        (OptimisticDataWriter *)0x0) {
      iVar4 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
      this_03 = (OptimisticDataWriter *)operator_new(0x10);
      OptimisticDataWriter::OptimisticDataWriter(this_03,(DataTable *)CONCAT44(extraout_var,iVar4));
      ::std::
      __uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
      ::reset((__uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
               *)&this_02->optimistic_writer,this_03);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if ((element_type *)this_02->current_index == batch_index) {
    this_01 = &this_02->constraint_state;
    if ((this_02->constraint_state).
        super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
        .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl ==
        (ConstraintState *)0x0) {
      iVar4 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
      DataTable::InitializeConstraintState
                ((DataTable *)local_68,(TableCatalogEntry *)CONCAT44(extraout_var_00,iVar4),
                 (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                  *)table_entry);
      uVar2 = local_68._0_8_;
      local_68._0_8_ = (element_type *)0x0;
      _Var1._M_head_impl =
           (this_01->
           super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
           .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl;
      (this_01->
      super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>)._M_t
      .super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
      .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
           (ConstraintState *)uVar2;
      if (_Var1._M_head_impl != (ConstraintState *)0x0) {
        operator_delete(_Var1._M_head_impl);
      }
      if ((element_type *)local_68._0_8_ != (element_type *)0x0) {
        operator_delete((void *)local_68._0_8_);
      }
    }
    iVar4 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
    this_04 = LocalStorage::Get(context->client,((DataTable *)CONCAT44(extraout_var_01,iVar4))->db);
    iVar5 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
    storage = LocalStorage::GetStorage(this_04,(DataTable *)CONCAT44(extraout_var_02,iVar5));
    constraint_state =
         unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true>::
         operator*(this_01);
    chunk._M_pi = local_38._M_pi;
    DataTable::VerifyAppendConstraints
              ((DataTable *)CONCAT44(extraout_var_01,iVar4),constraint_state,context->client,
               (DataChunk *)local_38._M_pi,storage,(optional_ptr<duckdb::ConflictManager,_true>)0x0)
    ;
    iVar4 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
    this_05 = DataTable::GetOptimisticCollection
                        ((DataTable *)CONCAT44(extraout_var_03,iVar4),context->client,
                         (PhysicalIndex)(this_02->collection_index).index);
    bVar3 = RowGroupCollection::Append
                      (this_05,(DataChunk *)chunk._M_pi,&this_02->current_append_state);
    if (bVar3) {
      this_06 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                ::operator->(&this_02->optimistic_writer);
      OptimisticDataWriter::WriteNewRowGroup(this_06,this_05);
    }
    return NEED_MORE_INPUT;
  }
  this_07 = (InternalException *)__cxa_allocate_exception(0x10);
  local_68._0_8_ = &stack0xffffffffffffffa8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"Current batch differs from batch - but NextBatch was not called!?",
             "");
  InternalException::InternalException(this_07,(string *)local_68);
  __cxa_throw(this_07,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkResultType PhysicalBatchInsert::Sink(ExecutionContext &context, DataChunk &insert_chunk,
                                         OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<BatchInsertGlobalState>();
	auto &lstate = input.local_state.Cast<BatchInsertLocalState>();
	auto &memory_manager = gstate.memory_manager;

	auto &table = gstate.table;
	insert_chunk.Flatten();

	auto batch_index = lstate.partition_info.batch_index.GetIndex();
	// check if we should process this batch
	if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
		memory_manager.UpdateMinBatchIndex(lstate.partition_info.min_batch_index.GetIndex());

		// we are not processing the current min batch index
		// check if we have exceeded the maximum number of unflushed rows
		if (memory_manager.OutOfMemory(batch_index)) {
			// out-of-memory
			// execute tasks while we wait (if any are available)
			ExecuteTasks(context.client, gstate, lstate);

			auto guard = memory_manager.Lock();
			if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
				//  we are not the minimum batch index and we have no memory available to buffer - block the task for
				//  now
				return memory_manager.BlockSink(guard, input.interrupt_state);
			}
		}
	}
	if (!lstate.collection_index.IsValid()) {
		lock_guard<mutex> l(gstate.lock);
		// no collection yet: create a new one
		lstate.CreateNewCollection(context.client, table, insert_types);
		if (!lstate.optimistic_writer) {
			lstate.optimistic_writer = make_uniq<OptimisticDataWriter>(table.GetStorage());
		}
	}

	if (lstate.current_index != batch_index) {
		throw InternalException("Current batch differs from batch - but NextBatch was not called!?");
	}

	if (!lstate.constraint_state) {
		lstate.constraint_state = table.GetStorage().InitializeConstraintState(table, bound_constraints);
	}

	auto &storage = table.GetStorage();
	auto &local_storage = LocalStorage::Get(context.client, storage.db);
	auto local_table_storage = local_storage.GetStorage(table.GetStorage());
	storage.VerifyAppendConstraints(*lstate.constraint_state, context.client, insert_chunk, local_table_storage,
	                                nullptr);

	auto &collection = table.GetStorage().GetOptimisticCollection(context.client, lstate.collection_index);
	auto new_row_group = collection.Append(insert_chunk, lstate.current_append_state);
	if (new_row_group) {
		// we have already written to disk - flush the next row group as well
		lstate.optimistic_writer->WriteNewRowGroup(collection);
	}
	return SinkResultType::NEED_MORE_INPUT;
}